

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_RH_ENDORSEMENT_Unmarshal
                 (TPMI_RH_ENDORSEMENT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(target,buffer,size);
  if ((TVar1 == 0) &&
     ((*target == 0x4000000b || ((TVar1 = 0x84, *target == 0x40000007 && (flag != 0)))))) {
    TVar1 = 0;
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMI_RH_ENDORSEMENT_Unmarshal(TPMI_RH_ENDORSEMENT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_ENDORSEMENT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}